

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_gear_aux(object *gear)

{
  wchar_t wVar1;
  object *local_18;
  object *obj;
  object *gear_local;
  
  local_18 = gear;
  while( true ) {
    if (local_18 == (object *)0x0) {
      wr_byte(0xff);
      return;
    }
    if (local_18->kind == (object_kind *)0x0) break;
    wVar1 = object_slot(player->body,local_18);
    wr_byte((uint8_t)wVar1);
    wr_item(local_18);
    local_18 = local_18->next;
  }
  __assert_fail("obj->kind",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/save.c"
                ,0x31e,"void wr_gear_aux(struct object *)");
}

Assistant:

static void wr_gear_aux(struct object *gear)
{
	struct object *obj;

	/* Write the inventory */
	for (obj = gear; obj; obj = obj->next) {
		/* Skip non-objects */
		assert(obj->kind);

		/* Write code for equipment or other gear */
		wr_byte(object_slot(player->body, obj));

		/* Dump object */
		wr_item(obj);

	}

	/* Write finished code */
	wr_byte(FINISHED_CODE);
}